

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::MultiPartOutputFile::Data::~Data(Data *this)

{
  value_type pOVar1;
  size_type sVar2;
  reference ppOVar3;
  long in_RDI;
  size_t i;
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *in_stack_ffffffffffffffe0;
  ulong local_10;
  
  if (((*(byte *)(in_RDI + 0x50) & 1) != 0) &&
     (in_stack_ffffffffffffffe0 =
           *(vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> **)(in_RDI + 0x28),
     in_stack_ffffffffffffffe0 != (vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)0x0))
  {
    (**(code **)&((_Rb_tree_header *)
                 ((long)&(((in_stack_ffffffffffffffe0->
                           super__Vector_base<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>).
                           _M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl + 8))->
                 _M_header)();
  }
  for (local_10 = 0;
      sVar2 = std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::
              size((vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_> *)
                   (in_RDI + 0x38)), local_10 < sVar2; local_10 = local_10 + 1) {
    ppOVar3 = std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::
              operator[]((vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>
                          *)(in_RDI + 0x38),local_10);
    pOVar1 = *ppOVar3;
    if (pOVar1 != (value_type)0x0) {
      OutputPartData::~OutputPartData((OutputPartData *)0x14aaf3);
      operator_delete(pOVar1,0x60);
    }
  }
  std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::~vector(in_stack_ffffffffffffffe0)
  ;
  std::
  map<int,_Imf_3_3::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>_>
  ::~map((map<int,_Imf_3_3::GenericOutputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_3_3::GenericOutputFile_*>_>_>
          *)0x14ab33);
  std::vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_>::~vector
            ((vector<Imf_3_3::OutputPartData_*,_std::allocator<Imf_3_3::OutputPartData_*>_> *)
             in_stack_ffffffffffffffe0);
  return;
}

Assistant:

~Data ()
    {
        if (deleteStream) delete os;

        for (size_t i = 0; i < parts.size (); i++)
            delete parts[i];
    }